

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall pybind11::detail::instance::allocate_layout(instance *this)

{
  ulong uVar1;
  bool bVar2;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *this_00;
  detail *this_01;
  const_reference pptVar3;
  size_t sVar4;
  reference pptVar5;
  void *pvVar6;
  bad_alloc *this_02;
  __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
  *__rhs;
  bool local_59;
  size_t flags_at;
  type_info *t;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range3;
  size_t space;
  size_t n_types;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *tinfo;
  instance *this_local;
  
  this_00 = all_type_info((this->ob_base).ob_type);
  this_01 = (detail *)
            std::
            vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
            size(this_00);
  if (this_01 == (detail *)0x0) {
    pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");
  }
  local_59 = false;
  if (this_01 == (detail *)0x1) {
    pptVar3 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::front(this_00);
    uVar1 = (*pptVar3)->holder_size_in_ptrs;
    sVar4 = instance_simple_holder_in_ptrs();
    local_59 = uVar1 <= sVar4;
  }
  this->field_0x30 = this->field_0x30 & 0xfd | local_59 << 1;
  if (((byte)this->field_0x30 >> 1 & 1) == 0) {
    __range3 = (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                *)0x0;
    __end3 = std::
             vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
             begin(this_00);
    t = (type_info *)
        std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
        end(this_00);
    while( true ) {
      __rhs = (__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
               *)&t;
      bVar2 = __gnu_cxx::operator!=(&__end3,__rhs);
      if (!bVar2) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                ::operator*(&__end3);
      __range3 = (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)&(__range3->
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                    (*pptVar5)->holder_size_in_ptrs + 1);
      __gnu_cxx::
      __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
      ::operator++(&__end3);
    }
    sVar4 = size_in_ptrs(this_01,(size_t)__rhs);
    pvVar6 = (void *)PyMem_Calloc((long)&(__range3->
                                         super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start + sVar4,8);
    (this->field_1).simple_value_holder[0] = pvVar6;
    if ((this->field_1).simple_value_holder[0] == (void *)0x0) {
      this_02 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_02);
      __cxa_throw(this_02,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->field_1).simple_value_holder[1] =
         (this->field_1).nonsimple.values_and_holders + (long)__range3;
  }
  else {
    (this->field_1).simple_value_holder[0] = (void *)0x0;
    this->field_0x30 = this->field_0x30 & 0xfb;
    this->field_0x30 = this->field_0x30 & 0xf7;
  }
  this->field_0x30 = this->field_0x30 & 0xfe | 1;
  return;
}

Assistant:

PYBIND11_NOINLINE void instance::allocate_layout() {
    auto &tinfo = all_type_info(Py_TYPE(this));

    const size_t n_types = tinfo.size();

    if (n_types == 0)
        pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");

    simple_layout =
        n_types == 1 && tinfo.front()->holder_size_in_ptrs <= instance_simple_holder_in_ptrs();

    // Simple path: no python-side multiple inheritance, and a small-enough holder
    if (simple_layout) {
        simple_value_holder[0] = nullptr;
        simple_holder_constructed = false;
        simple_instance_registered = false;
    }
    else { // multiple base types or a too-large holder
        // Allocate space to hold: [v1*][h1][v2*][h2]...[bb...] where [vN*] is a value pointer,
        // [hN] is the (uninitialized) holder instance for value N, and [bb...] is a set of bool
        // values that tracks whether each associated holder has been initialized.  Each [block] is
        // padded, if necessary, to an integer multiple of sizeof(void *).
        size_t space = 0;
        for (auto t : tinfo) {
            space += 1; // value pointer
            space += t->holder_size_in_ptrs; // holder instance
        }
        size_t flags_at = space;
        space += size_in_ptrs(n_types); // status bytes (holder_constructed and instance_registered)

        // Allocate space for flags, values, and holders, and initialize it to 0 (flags and values,
        // in particular, need to be 0).  Use Python's memory allocation functions: in Python 3.6
        // they default to using pymalloc, which is designed to be efficient for small allocations
        // like the one we're doing here; in earlier versions (and for larger allocations) they are
        // just wrappers around malloc.
#if PY_VERSION_HEX >= 0x03050000
        nonsimple.values_and_holders = (void **) PyMem_Calloc(space, sizeof(void *));
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
#else
        nonsimple.values_and_holders = (void **) PyMem_New(void *, space);
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
        std::memset(nonsimple.values_and_holders, 0, space * sizeof(void *));
#endif
        nonsimple.status = reinterpret_cast<std::uint8_t *>(&nonsimple.values_and_holders[flags_at]);
    }
    owned = true;
}